

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

void slang::ast::BinaryExpression::analyzeOpTypes
               (Type *clt,Type *crt,Type *originalLt,Type *originalRt,Expression *lhs,
               Expression *rhs,ASTContext *context,SourceRange opRange,DiagCode code,
               bool isComparison,
               optional<std::basic_string_view<char,_std::char_traits<char>_>_> extraDiagArg)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  DiagCode code_00;
  DiagCode code_01;
  string_view arg;
  bool bVar1;
  bool bVar2;
  __optional_ge_t<unsigned_int,_unsigned_int> _Var3;
  EffectiveSign left;
  EffectiveSign right;
  bitwidth_t bVar4;
  EvalContext *pEVar5;
  long in_R8;
  long in_R9;
  EvalContext *in_stack_00000008;
  byte in_stack_00000028;
  Diagnostic *diag;
  ConstantValue rcv;
  ConstantValue lcv;
  EvalContext evalCtx_1;
  EvalContext evalCtx;
  optional<unsigned_int> erw;
  optional<unsigned_int> elw;
  bitwidth_t arw;
  bitwidth_t alw;
  Diagnostic *diag_1;
  bool sameSign;
  anon_class_1_0_00000001 isEnumBaseCompare;
  Symbol *rsym;
  Symbol *lsym;
  anon_class_1_0_00000001 isCompGenVar;
  undefined4 in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6dc;
  EvalContext *in_stack_fffffffffffff6e0;
  undefined5 in_stack_fffffffffffff6e8;
  byte in_stack_fffffffffffff6ed;
  undefined1 in_stack_fffffffffffff6ee;
  logic_t in_stack_fffffffffffff6ef;
  SourceLocation in_stack_fffffffffffff6f0;
  uint in_stack_fffffffffffff6f8;
  undefined1 in_stack_fffffffffffff6fc;
  byte in_stack_fffffffffffff6fd;
  undefined1 in_stack_fffffffffffff6fe;
  logic_t in_stack_fffffffffffff6ff;
  SVInt *in_stack_fffffffffffff700;
  undefined6 in_stack_fffffffffffff708;
  byte in_stack_fffffffffffff70e;
  undefined1 in_stack_fffffffffffff70f;
  undefined1 in_stack_fffffffffffff710;
  undefined1 in_stack_fffffffffffff711;
  undefined1 in_stack_fffffffffffff712;
  undefined1 in_stack_fffffffffffff713;
  undefined1 in_stack_fffffffffffff714;
  undefined1 in_stack_fffffffffffff715;
  undefined1 in_stack_fffffffffffff716;
  undefined1 in_stack_fffffffffffff717;
  EvalContext *in_stack_fffffffffffff718;
  Diagnostic *in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff728;
  undefined1 in_stack_fffffffffffff72c;
  compare_three_way_result_t<unsigned_int,_unsigned_int> in_stack_fffffffffffff72d;
  byte in_stack_fffffffffffff72e;
  byte in_stack_fffffffffffff72f;
  EvalContext *in_stack_fffffffffffff730;
  bool local_8b1;
  Expression *in_stack_fffffffffffff768;
  bitmask<slang::ast::EvalFlags> local_7c1;
  Diagnostic local_7c0 [7];
  int local_470;
  __unspec local_46a;
  type local_469;
  bitmask<slang::ast::EvalFlags> local_401 [855];
  __unspec local_aa;
  type local_a9;
  _Optional_payload_base<unsigned_int> local_a8;
  _Optional_payload_base<unsigned_int> local_a0;
  bitwidth_t local_98;
  bitwidth_t local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined4 local_5c;
  Diagnostic *local_58;
  bool local_4a;
  undefined1 local_49;
  Symbol *local_48;
  Symbol *local_40;
  undefined1 local_32;
  byte local_31;
  long local_30;
  long local_28;
  
  local_31 = in_stack_00000028 & 1;
  local_32 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_40 = Expression::getSymbolReference
                       ((Expression *)
                        CONCAT17(in_stack_fffffffffffff72f,
                                 CONCAT16(in_stack_fffffffffffff72e,
                                          CONCAT15(in_stack_fffffffffffff72d._M_value,
                                                   CONCAT14(in_stack_fffffffffffff72c,
                                                            in_stack_fffffffffffff728)))),
                        SUB81((ulong)in_stack_fffffffffffff720 >> 0x38,0));
  local_48 = Expression::getSymbolReference
                       ((Expression *)
                        CONCAT17(in_stack_fffffffffffff72f,
                                 CONCAT16(in_stack_fffffffffffff72e,
                                          CONCAT15(in_stack_fffffffffffff72d._M_value,
                                                   CONCAT14(in_stack_fffffffffffff72c,
                                                            in_stack_fffffffffffff728)))),
                        SUB81((ulong)in_stack_fffffffffffff720 >> 0x38,0));
  bVar1 = analyzeOpTypes::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)
                     CONCAT17(in_stack_fffffffffffff6ef.value,
                              CONCAT16(in_stack_fffffffffffff6ee,
                                       CONCAT15(in_stack_fffffffffffff6ed,in_stack_fffffffffffff6e8)
                                      )),(Symbol *)in_stack_fffffffffffff6e0);
  if (bVar1) {
    return;
  }
  bVar1 = analyzeOpTypes::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)
                     CONCAT17(in_stack_fffffffffffff6ef.value,
                              CONCAT16(in_stack_fffffffffffff6ee,
                                       CONCAT15(in_stack_fffffffffffff6ed,in_stack_fffffffffffff6e8)
                                      )),(Symbol *)in_stack_fffffffffffff6e0);
  if (bVar1) {
    return;
  }
  local_49 = 0;
  if ((local_31 & 1) != 0) {
    bVar1 = analyzeOpTypes::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       CONCAT17(in_stack_fffffffffffff6ef.value,
                                CONCAT16(in_stack_fffffffffffff6ee,
                                         CONCAT15(in_stack_fffffffffffff6ed,
                                                  in_stack_fffffffffffff6e8))),
                       (Symbol *)in_stack_fffffffffffff6e0,
                       (Type *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    if (bVar1) {
      return;
    }
    bVar1 = analyzeOpTypes::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       CONCAT17(in_stack_fffffffffffff6ef.value,
                                CONCAT16(in_stack_fffffffffffff6ee,
                                         CONCAT15(in_stack_fffffffffffff6ed,
                                                  in_stack_fffffffffffff6e8))),
                       (Symbol *)in_stack_fffffffffffff6e0,
                       (Type *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    if (bVar1) {
      return;
    }
  }
  bVar1 = Type::isSimpleBitVector
                    ((Type *)CONCAT17(in_stack_fffffffffffff6ef.value,
                                      CONCAT16(in_stack_fffffffffffff6ee,
                                               CONCAT15(in_stack_fffffffffffff6ed,
                                                        in_stack_fffffffffffff6e8))));
  if ((bVar1) &&
     (bVar1 = Type::isSimpleBitVector
                        ((Type *)CONCAT17(in_stack_fffffffffffff6ef.value,
                                          CONCAT16(in_stack_fffffffffffff6ee,
                                                   CONCAT15(in_stack_fffffffffffff6ed,
                                                            in_stack_fffffffffffff6e8)))), bVar1)) {
    bVar1 = Type::isSigned((Type *)in_stack_fffffffffffff6e0);
    bVar2 = Type::isSigned((Type *)in_stack_fffffffffffff6e0);
    local_8b1 = true;
    if (bVar1 != bVar2) {
      left = Expression::getEffectiveSign
                       ((Expression *)in_stack_fffffffffffff6e0,
                        SUB41((uint)in_stack_fffffffffffff6dc >> 0x18,0));
      right = Expression::getEffectiveSign
                        ((Expression *)in_stack_fffffffffffff6e0,
                         SUB41((uint)in_stack_fffffffffffff6dc >> 0x18,0));
      local_8b1 = Expression::signMatches(left,right);
    }
    local_4a = local_8b1;
    if ((local_31 & 1) != 0) {
      if (local_8b1 != false) {
        return;
      }
      bVar4 = Type::getBitWidth((Type *)CONCAT17(in_stack_fffffffffffff6ef.value,
                                                 CONCAT16(in_stack_fffffffffffff6ee,
                                                          CONCAT15(in_stack_fffffffffffff6ed,
                                                                   in_stack_fffffffffffff6e8))));
      if (((bVar4 == 8) && (bVar1 = Type::isPredefinedInteger((Type *)0x84645a), bVar1)) &&
         (bVar1 = Expression::isImplicitString(in_stack_fffffffffffff768), bVar1)) {
        return;
      }
      bVar4 = Type::getBitWidth((Type *)CONCAT17(in_stack_fffffffffffff6ef.value,
                                                 CONCAT16(in_stack_fffffffffffff6ee,
                                                          CONCAT15(in_stack_fffffffffffff6ed,
                                                                   in_stack_fffffffffffff6e8))));
      if (((bVar4 == 8) && (bVar1 = Type::isPredefinedInteger((Type *)0x846490), bVar1)) &&
         (bVar1 = Expression::isImplicitString(in_stack_fffffffffffff768), bVar1)) {
        return;
      }
      local_5c = 0xd30007;
      code_00.subsystem._1_1_ = in_stack_fffffffffffff715;
      code_00.subsystem._0_1_ = in_stack_fffffffffffff714;
      code_00.code._0_1_ = in_stack_fffffffffffff716;
      code_00.code._1_1_ = in_stack_fffffffffffff717;
      sourceRange.endLoc._0_6_ = in_stack_fffffffffffff708;
      sourceRange.startLoc = (SourceLocation)in_stack_fffffffffffff700;
      sourceRange.endLoc._6_1_ = in_stack_fffffffffffff70e;
      sourceRange.endLoc._7_1_ = in_stack_fffffffffffff70f;
      local_58 = ASTContext::addDiag((ASTContext *)
                                     CONCAT17(in_stack_fffffffffffff6ff.value,
                                              CONCAT16(in_stack_fffffffffffff6fe,
                                                       CONCAT15(in_stack_fffffffffffff6fd,
                                                                CONCAT14(in_stack_fffffffffffff6fc,
                                                                         in_stack_fffffffffffff6f8))
                                                      )),code_00,sourceRange);
      ast::operator<<((Diagnostic *)in_stack_fffffffffffff730,
                      (Type *)CONCAT17(in_stack_fffffffffffff72f,
                                       CONCAT16(in_stack_fffffffffffff72e,
                                                CONCAT15(in_stack_fffffffffffff72d._M_value,
                                                         CONCAT14(in_stack_fffffffffffff72c,
                                                                  in_stack_fffffffffffff728)))));
      ast::operator<<((Diagnostic *)in_stack_fffffffffffff730,
                      (Type *)CONCAT17(in_stack_fffffffffffff72f,
                                       CONCAT16(in_stack_fffffffffffff72e,
                                                CONCAT15(in_stack_fffffffffffff72d._M_value,
                                                         CONCAT14(in_stack_fffffffffffff72c,
                                                                  in_stack_fffffffffffff728)))));
      local_80 = *(undefined8 *)(local_28 + 0x20);
      local_78 = *(undefined8 *)(local_28 + 0x28);
      range.startLoc._5_1_ = in_stack_fffffffffffff6ed;
      range.startLoc._0_5_ = in_stack_fffffffffffff6e8;
      range.startLoc._6_1_ = in_stack_fffffffffffff6ee;
      range.startLoc._7_1_ = in_stack_fffffffffffff6ef.value;
      range.endLoc = in_stack_fffffffffffff6f0;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff6e0,range);
      local_90 = *(undefined8 *)(local_30 + 0x20);
      local_88 = *(undefined8 *)(local_30 + 0x28);
      range_00.startLoc._5_1_ = in_stack_fffffffffffff6ed;
      range_00.startLoc._0_5_ = in_stack_fffffffffffff6e8;
      range_00.startLoc._6_1_ = in_stack_fffffffffffff6ee;
      range_00.startLoc._7_1_ = in_stack_fffffffffffff6ef.value;
      range_00.endLoc = in_stack_fffffffffffff6f0;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff6e0,range_00);
      return;
    }
    if (local_8b1 == false) goto LAB_00846dbe;
    local_94 = Type::getBitWidth((Type *)CONCAT17(in_stack_fffffffffffff6ef.value,
                                                  CONCAT16(in_stack_fffffffffffff6ee,
                                                           CONCAT15(in_stack_fffffffffffff6ed,
                                                                    in_stack_fffffffffffff6e8))));
    local_98 = Type::getBitWidth((Type *)CONCAT17(in_stack_fffffffffffff6ef.value,
                                                  CONCAT16(in_stack_fffffffffffff6ee,
                                                           CONCAT15(in_stack_fffffffffffff6ed,
                                                                    in_stack_fffffffffffff6e8))));
    if (local_94 == local_98) {
      return;
    }
    local_a0 = (_Optional_payload_base<unsigned_int>)
               Expression::getEffectiveWidth
                         ((Expression *)
                          CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    local_a8 = (_Optional_payload_base<unsigned_int>)
               Expression::getEffectiveWidth
                         ((Expression *)
                          CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x846629);
    if (!bVar1) {
      return;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x84663c);
    if (!bVar1) {
      return;
    }
    local_a9 = (type)std::operator<=><unsigned_int,_unsigned_int>
                               ((optional<unsigned_int> *)
                                CONCAT17(in_stack_fffffffffffff6ef.value,
                                         CONCAT16(in_stack_fffffffffffff6ee,
                                                  CONCAT15(in_stack_fffffffffffff6ed,
                                                           in_stack_fffffffffffff6e8))),
                                (uint *)in_stack_fffffffffffff6e0);
    std::__cmp_cat::__unspec::__unspec(&local_aa,(__unspec *)0x0);
    bVar1 = std::operator<=(local_a9);
    if ((bVar1) &&
       (_Var3 = std::operator>=((uint *)in_stack_fffffffffffff6e0,
                                (optional<unsigned_int> *)
                                CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8)),
       _Var3)) {
      return;
    }
    local_401[0].m_bits = '\0';
    bitmask<slang::ast::EvalFlags>::bitmask(local_401);
    EvalContext::EvalContext
              (in_stack_fffffffffffff718,
               (ASTContext *)
               CONCAT17(in_stack_fffffffffffff717,
                        CONCAT16(in_stack_fffffffffffff716,
                                 CONCAT15(in_stack_fffffffffffff715,
                                          CONCAT14(in_stack_fffffffffffff714,
                                                   CONCAT13(in_stack_fffffffffffff713,
                                                            CONCAT12(in_stack_fffffffffffff712,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff711,
                                                  in_stack_fffffffffffff710))))))),
               (bitmask<slang::ast::EvalFlags>)
               (underlying_type)((ulong)in_stack_fffffffffffff720 >> 0x38));
    Expression::eval((Expression *)
                     CONCAT17(in_stack_fffffffffffff6ef.value,
                              CONCAT16(in_stack_fffffffffffff6ee,
                                       CONCAT15(in_stack_fffffffffffff6ed,in_stack_fffffffffffff6e8)
                                      )),in_stack_fffffffffffff6e0);
    in_stack_fffffffffffff72f =
         slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x84670f);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x846722);
    if ((in_stack_fffffffffffff72f & 1) != 0) {
      local_94 = 0xffffff;
    }
    Expression::eval((Expression *)
                     CONCAT17(in_stack_fffffffffffff6ef.value,
                              CONCAT16(in_stack_fffffffffffff6ee,
                                       CONCAT15(in_stack_fffffffffffff6ed,in_stack_fffffffffffff6e8)
                                      )),in_stack_fffffffffffff6e0);
    in_stack_fffffffffffff72e =
         slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8467a4);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x8467b7);
    if ((in_stack_fffffffffffff72e & 1) != 0) {
      local_98 = 0xffffff;
    }
    in_stack_fffffffffffff72d =
         std::operator<=><unsigned_int,_unsigned_int>
                   ((optional<unsigned_int> *)
                    CONCAT17(in_stack_fffffffffffff6ef.value,
                             CONCAT16(in_stack_fffffffffffff6ee,
                                      CONCAT15(in_stack_fffffffffffff6ed,in_stack_fffffffffffff6e8))
                            ),(uint *)in_stack_fffffffffffff6e0);
    local_469 = in_stack_fffffffffffff72d._M_value;
    std::__cmp_cat::__unspec::__unspec(&local_46a,(__unspec *)0x0);
    bVar1 = std::operator<=(local_469);
    if ((bVar1) &&
       (in_stack_fffffffffffff72c =
             std::operator>=((uint *)in_stack_fffffffffffff6e0,
                             (optional<unsigned_int> *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8)),
       (bool)in_stack_fffffffffffff72c)) {
      local_470 = 1;
    }
    else {
      local_470 = 0;
    }
    EvalContext::~EvalContext(in_stack_fffffffffffff6e0);
    in_stack_fffffffffffff730 = in_stack_00000008;
  }
  else {
    bVar1 = Type::isHandleType((Type *)CONCAT17(in_stack_fffffffffffff6ef.value,
                                                CONCAT16(in_stack_fffffffffffff6ee,
                                                         CONCAT15(in_stack_fffffffffffff6ed,
                                                                  in_stack_fffffffffffff6e8))));
    if ((bVar1) &&
       (bVar1 = Type::isHandleType((Type *)CONCAT17(in_stack_fffffffffffff6ef.value,
                                                    CONCAT16(in_stack_fffffffffffff6ee,
                                                             CONCAT15(in_stack_fffffffffffff6ed,
                                                                      in_stack_fffffffffffff6e8)))),
       bVar1)) {
      return;
    }
    bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffff6e0);
    if ((!bVar1) || (bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffff6e0), !bVar1)) {
      bVar1 = Type::isString((Type *)0x846d76);
      if ((bVar1) && (bVar1 = Expression::isImplicitString(in_stack_fffffffffffff768), bVar1)) {
        return;
      }
      bVar1 = Type::isString((Type *)0x846d9a);
      if ((bVar1) && (bVar1 = Expression::isImplicitString(in_stack_fffffffffffff768), bVar1)) {
        return;
      }
      goto LAB_00846dbe;
    }
    local_7c1.m_bits = '\0';
    bitmask<slang::ast::EvalFlags>::bitmask(&local_7c1);
    in_stack_fffffffffffff720 = local_7c0;
    EvalContext::EvalContext
              (in_stack_00000008,
               (ASTContext *)
               CONCAT17(in_stack_fffffffffffff717,
                        CONCAT16(in_stack_fffffffffffff716,
                                 CONCAT15(in_stack_fffffffffffff715,
                                          CONCAT14(in_stack_fffffffffffff714,
                                                   CONCAT13(in_stack_fffffffffffff713,
                                                            CONCAT12(in_stack_fffffffffffff712,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff711,
                                                  in_stack_fffffffffffff710))))))),
               (bitmask<slang::ast::EvalFlags>)
               (underlying_type)((ulong)in_stack_fffffffffffff720 >> 0x38));
    Expression::eval((Expression *)
                     CONCAT17(in_stack_fffffffffffff6ef.value,
                              CONCAT16(in_stack_fffffffffffff6ee,
                                       CONCAT15(in_stack_fffffffffffff6ed,in_stack_fffffffffffff6e8)
                                      )),in_stack_fffffffffffff6e0);
    Expression::eval((Expression *)
                     CONCAT17(in_stack_fffffffffffff6ef.value,
                              CONCAT16(in_stack_fffffffffffff6ee,
                                       CONCAT15(in_stack_fffffffffffff6ed,in_stack_fffffffffffff6e8)
                                      )),in_stack_fffffffffffff6e0);
    in_stack_fffffffffffff717 =
         slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x846993);
    if ((!(bool)in_stack_fffffffffffff717) &&
       (in_stack_fffffffffffff716 =
             slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8469b0),
       !(bool)in_stack_fffffffffffff716)) goto LAB_00846cf7;
    in_stack_fffffffffffff715 = Type::isFloating((Type *)0x8469d0);
    if (((bool)in_stack_fffffffffffff715) &&
       ((in_stack_fffffffffffff714 = Type::isIntegral((Type *)in_stack_fffffffffffff6e0),
        (bool)in_stack_fffffffffffff714 &&
        (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x846a0d), bVar1)))) {
      local_470 = 1;
    }
    else {
      bVar1 = Type::isFloating((Type *)0x846a85);
      if ((bVar1) &&
         ((bVar1 = Type::isIntegral((Type *)in_stack_fffffffffffff6e0), bVar1 &&
          (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x846abf), bVar1))))
      {
        local_470 = 1;
      }
      else if ((local_31 & 1) == 0) {
LAB_00846cf7:
        local_470 = 0;
      }
      else {
        in_stack_fffffffffffff70f = slang::ConstantValue::isInteger((ConstantValue *)0x846b02);
        in_stack_fffffffffffff6fd = 0;
        in_stack_fffffffffffff70e = in_stack_fffffffffffff6fd;
        if ((bool)in_stack_fffffffffffff70f) {
          in_stack_fffffffffffff700 = slang::ConstantValue::integer((ConstantValue *)0x846b26);
          SVInt::SVInt<int>((SVInt *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6dc);
          in_stack_fffffffffffff6ff =
               SVInt::operator==((SVInt *)CONCAT17(in_stack_fffffffffffff70f,
                                                   CONCAT16(in_stack_fffffffffffff6fd,
                                                            in_stack_fffffffffffff708)),
                                 in_stack_fffffffffffff700);
          in_stack_fffffffffffff6fd =
               logic_t::operator_cast_to_bool((logic_t *)in_stack_fffffffffffff6e0);
          in_stack_fffffffffffff6fe = in_stack_fffffffffffff6fd;
          in_stack_fffffffffffff70e = in_stack_fffffffffffff6fd;
          SVInt::~SVInt((SVInt *)in_stack_fffffffffffff6f0);
        }
        if ((in_stack_fffffffffffff6fd & 1) == 0) {
          bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0x846c08);
          in_stack_fffffffffffff6f8 = in_stack_fffffffffffff6f8 & 0xffffff;
          in_stack_fffffffffffff6fc = bVar1;
          if (bVar1) {
            in_stack_fffffffffffff6f0 =
                 (SourceLocation)slang::ConstantValue::integer((ConstantValue *)0x846c2c);
            SVInt::SVInt<int>((SVInt *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6dc);
            in_stack_fffffffffffff6ef =
                 SVInt::operator==((SVInt *)CONCAT17(in_stack_fffffffffffff70f,
                                                     CONCAT16(in_stack_fffffffffffff70e,
                                                              in_stack_fffffffffffff708)),
                                   in_stack_fffffffffffff700);
            in_stack_fffffffffffff6ee =
                 logic_t::operator_cast_to_bool((logic_t *)in_stack_fffffffffffff6e0);
            in_stack_fffffffffffff6f8 =
                 CONCAT13(in_stack_fffffffffffff6ee,(int3)in_stack_fffffffffffff6f8);
          }
          in_stack_fffffffffffff6ed = (byte)(in_stack_fffffffffffff6f8 >> 0x18);
          if (bVar1) {
            SVInt::~SVInt((SVInt *)in_stack_fffffffffffff6f0);
          }
          if ((in_stack_fffffffffffff6ed & 1) == 0) goto LAB_00846cf7;
          local_470 = 1;
        }
        else {
          local_470 = 1;
        }
      }
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x846d0f);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x846d1c);
    EvalContext::~EvalContext(in_stack_fffffffffffff6e0);
  }
  if (local_470 != 0) {
    return;
  }
LAB_00846dbe:
  code_01.subsystem._1_1_ = in_stack_fffffffffffff715;
  code_01.subsystem._0_1_ = in_stack_fffffffffffff714;
  code_01.code._0_1_ = in_stack_fffffffffffff716;
  code_01.code._1_1_ = in_stack_fffffffffffff717;
  sourceRange_00.endLoc._0_6_ = in_stack_fffffffffffff708;
  sourceRange_00.startLoc = (SourceLocation)in_stack_fffffffffffff700;
  sourceRange_00.endLoc._6_1_ = in_stack_fffffffffffff70e;
  sourceRange_00.endLoc._7_1_ = in_stack_fffffffffffff70f;
  pEVar5 = (EvalContext *)
           ASTContext::addDiag((ASTContext *)
                               CONCAT17(in_stack_fffffffffffff6ff.value,
                                        CONCAT16(in_stack_fffffffffffff6fe,
                                                 CONCAT15(in_stack_fffffffffffff6fd,
                                                          CONCAT14(in_stack_fffffffffffff6fc,
                                                                   in_stack_fffffffffffff6f8)))),
                               code_01,sourceRange_00);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x846e21);
  if (bVar1) {
    std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x846e3e);
    arg._M_len._4_1_ = in_stack_fffffffffffff72c;
    arg._M_len._0_4_ = in_stack_fffffffffffff728;
    arg._M_len._5_1_ = in_stack_fffffffffffff72d._M_value;
    arg._M_len._6_1_ = in_stack_fffffffffffff72e;
    arg._M_len._7_1_ = in_stack_fffffffffffff72f;
    arg._M_str = (char *)in_stack_fffffffffffff730;
    Diagnostic::operator<<(in_stack_fffffffffffff720,arg);
    in_stack_fffffffffffff6e0 = pEVar5;
  }
  ast::operator<<((Diagnostic *)in_stack_fffffffffffff730,
                  (Type *)CONCAT17(in_stack_fffffffffffff72f,
                                   CONCAT16(in_stack_fffffffffffff72e,
                                            CONCAT15(in_stack_fffffffffffff72d._M_value,
                                                     CONCAT14(in_stack_fffffffffffff72c,
                                                              in_stack_fffffffffffff728)))));
  ast::operator<<((Diagnostic *)in_stack_fffffffffffff730,
                  (Type *)CONCAT17(in_stack_fffffffffffff72f,
                                   CONCAT16(in_stack_fffffffffffff72e,
                                            CONCAT15(in_stack_fffffffffffff72d._M_value,
                                                     CONCAT14(in_stack_fffffffffffff72c,
                                                              in_stack_fffffffffffff728)))));
  range_01.startLoc._5_1_ = in_stack_fffffffffffff6ed;
  range_01.startLoc._0_5_ = in_stack_fffffffffffff6e8;
  range_01.startLoc._6_1_ = in_stack_fffffffffffff6ee;
  range_01.startLoc._7_1_ = in_stack_fffffffffffff6ef.value;
  range_01.endLoc = in_stack_fffffffffffff6f0;
  Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff6e0,range_01);
  range_02.startLoc._5_1_ = in_stack_fffffffffffff6ed;
  range_02.startLoc._0_5_ = in_stack_fffffffffffff6e8;
  range_02.startLoc._6_1_ = in_stack_fffffffffffff6ee;
  range_02.startLoc._7_1_ = in_stack_fffffffffffff6ef.value;
  range_02.endLoc = in_stack_fffffffffffff6f0;
  Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff6e0,range_02);
  return;
}

Assistant:

void BinaryExpression::analyzeOpTypes(const Type& clt, const Type& crt, const Type& originalLt,
                                      const Type& originalRt, const Expression& lhs,
                                      const Expression& rhs, const ASTContext& context,
                                      SourceRange opRange, DiagCode code, bool isComparison,
                                      std::optional<std::string_view> extraDiagArg) {
    // Don't warn if either side is a compiler generated variable
    // (which can be true for genvars).
    auto isCompGenVar = [](const Symbol* sym) {
        if (sym) {
            if (sym->kind == SymbolKind::Variable &&
                sym->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {
                return true;
            }

            if (sym->kind == SymbolKind::Parameter && sym->as<ParameterSymbol>().isFromGenvar()) {
                return true;
            }
        }
        return false;
    };

    auto lsym = lhs.getSymbolReference(), rsym = rhs.getSymbolReference();
    if (isCompGenVar(lsym) || isCompGenVar(rsym))
        return;

    // Don't warn if either side is an enum value symbol and the
    // other side is the base type of that enum.
    auto isEnumBaseCompare = [](const Symbol* sym, const Type& otherType) {
        if (sym && sym->kind == SymbolKind::EnumValue) {
            auto& ct = sym->as<EnumValueSymbol>().getType().getCanonicalType();
            if (ct.kind == SymbolKind::EnumType)
                return ct.as<EnumType>().baseType.isMatching(otherType);
        }
        return false;
    };

    if (isComparison && (isEnumBaseCompare(lsym, crt) || isEnumBaseCompare(rsym, clt)))
        return;

    if (clt.isSimpleBitVector() && crt.isSimpleBitVector()) {
        const bool sameSign = clt.isSigned() == crt.isSigned() ||
                              signMatches(lhs.getEffectiveSign(/* isForConversion */ false),
                                          rhs.getEffectiveSign(/* isForConversion */ false));

        if (isComparison) {
            // Comparisons of bit vectors should warn if the signs differ and
            // otherwise should not warn, otherwise you can get quite misleading
            // results like:
            //      logic [7:0] a, b;
            //      bit b = a + b < 257;
            // We don't want a warning for the comparison between logic[7:0] and
            // int because the addition will actually be promoted correctly and
            // everything will work as expected.
            if (sameSign)
                return;

            if ((clt.getBitWidth() == 8 && clt.isPredefinedInteger() && rhs.isImplicitString()) ||
                (crt.getBitWidth() == 8 && crt.isPredefinedInteger() && lhs.isImplicitString())) {
                // Don't warn if the comparison is between `byte` and a string literal.
                return;
            }

            auto& diag = context.addDiag(diag::SignCompare, opRange);
            SLANG_ASSERT(!extraDiagArg);
            diag << originalLt << originalRt;
            diag << lhs.sourceRange << rhs.sourceRange;
            return;
        }

        if (sameSign) {
            // If we have two integers of the same effective sign and size
            // (using the same ideas as in checkImplicitConversions) then we
            // should not warn.
            auto alw = clt.getBitWidth();
            auto arw = crt.getBitWidth();
            if (alw == arw)
                return;

            auto elw = lhs.getEffectiveWidth();
            auto erw = rhs.getEffectiveWidth();
            if (!elw || !erw)
                return;

            if (elw <= arw && alw >= erw)
                return;

            // If either side is a constant we'll assume the max allowed
            // width is actually unbounded.
            EvalContext evalCtx(context);
            if (lhs.eval(evalCtx))
                alw = SVInt::MAX_BITS;
            if (rhs.eval(evalCtx))
                arw = SVInt::MAX_BITS;

            if (elw <= arw && alw >= erw)
                return;
        }
    }
    else if (clt.isHandleType() && crt.isHandleType()) {
        // Ignore operations between handles (like comparing a class handle with null).
        return;
    }
    else if (clt.isNumeric() && crt.isNumeric()) {
        // If either side is a constant we might want to avoid warning.
        // The cases that I think make sense are:
        // - comparing any numeric value against the constant 0
        // - any floating value operator alongside an integer constant
        EvalContext evalCtx(context);
        auto lcv = lhs.eval(evalCtx);
        auto rcv = rhs.eval(evalCtx);
        if (lcv || rcv) {
            if (clt.isFloating() && crt.isIntegral() && rcv)
                return;
            if (crt.isFloating() && clt.isIntegral() && lcv)
                return;

            if (isComparison) {
                if (lcv.isInteger() && bool(lcv.integer() == 0))
                    return;
                if (rcv.isInteger() && bool(rcv.integer() == 0))
                    return;
            }
        }
    }
    else if ((clt.isString() && rhs.isImplicitString()) ||
             (crt.isString() && lhs.isImplicitString())) {
        // Ignore operations between strings and string literals.
        return;
    }

    auto& diag = context.addDiag(code, opRange);
    if (extraDiagArg)
        diag << *extraDiagArg;
    diag << originalLt << originalRt;
    diag << lhs.sourceRange << rhs.sourceRange;
}